

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pow.cpp
# Opt level: O0

uint GetNextWorkRequired(CBlockIndex *pindexLast,CBlockHeader *pblock,Params *params)

{
  long lVar1;
  CBlockIndex *pindexLast_00;
  int64_t iVar2;
  int64_t iVar3;
  long lVar4;
  CBlockIndex *pCVar5;
  long in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar6;
  CBlockIndex *pindexFirst;
  int nHeightFirst;
  CBlockIndex *pindex;
  uint nProofOfWorkLimit;
  Params *in_stack_ffffffffffffff58;
  int iVar7;
  uint256 *in_stack_ffffffffffffff70;
  arith_uint256 *in_stack_ffffffffffffff78;
  int height;
  undefined7 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff87;
  int64_t in_stack_ffffffffffffff88;
  long local_58;
  uint32_t local_2c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == 0) {
    __assert_fail("pindexLast != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pow.cpp"
                  ,0xf,
                  "unsigned int GetNextWorkRequired(const CBlockIndex *, const CBlockHeader *, const Consensus::Params &)"
                 );
  }
  UintToArith256(in_stack_ffffffffffffff70);
  local_2c = arith_uint256::GetCompact
                       (in_stack_ffffffffffffff78,SUB81((ulong)in_stack_ffffffffffffff70 >> 0x38,0))
  ;
  height = (int)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pindexLast_00 = (CBlockIndex *)(long)(*(int *)(in_RDI + 0x18) + 1);
  iVar2 = Consensus::Params::DifficultyAdjustmentInterval(in_stack_ffffffffffffff58);
  if ((long)pindexLast_00 % iVar2 == 0) {
    iVar7 = *(int *)(in_RDI + 0x18);
    iVar2 = Consensus::Params::DifficultyAdjustmentInterval(in_stack_ffffffffffffff58);
    if (iVar7 - ((int)iVar2 + -1) < 0) {
      __assert_fail("nHeightFirst >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pow.cpp"
                    ,0x2a,
                    "unsigned int GetNextWorkRequired(const CBlockIndex *, const CBlockHeader *, const Consensus::Params &)"
                   );
    }
    pCVar5 = CBlockIndex::GetAncestor
                       ((CBlockIndex *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80)
                        ,height);
    if (pCVar5 == (CBlockIndex *)0x0) {
      __assert_fail("pindexFirst",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/pow.cpp"
                    ,0x2c,
                    "unsigned int GetNextWorkRequired(const CBlockIndex *, const CBlockHeader *, const Consensus::Params &)"
                   );
    }
    CBlockIndex::GetBlockTime((CBlockIndex *)in_stack_ffffffffffffff58);
    local_2c = CalculateNextWorkRequired
                         (pindexLast_00,in_stack_ffffffffffffff88,
                          (Params *)CONCAT17(in_stack_ffffffffffffff87,in_stack_ffffffffffffff80));
  }
  else if ((*(byte *)(in_RDX + 0xf8) & 1) == 0) {
    local_2c = *(uint32_t *)(in_RDI + 0x84);
  }
  else {
    iVar2 = CBlockHeader::GetBlockTime((CBlockHeader *)in_stack_ffffffffffffff58);
    iVar3 = CBlockIndex::GetBlockTime((CBlockIndex *)in_stack_ffffffffffffff58);
    local_58 = in_RDI;
    if (iVar2 <= iVar3 + *(long *)(in_RDX + 0x100) * 2) {
      while( true ) {
        bVar6 = false;
        if (*(long *)(local_58 + 8) != 0) {
          lVar4 = (long)*(int *)(local_58 + 0x18);
          iVar2 = Consensus::Params::DifficultyAdjustmentInterval(in_stack_ffffffffffffff58);
          bVar6 = false;
          if (lVar4 % iVar2 != 0) {
            bVar6 = *(uint32_t *)(local_58 + 0x84) == local_2c;
          }
        }
        if (!bVar6) break;
        local_58 = *(long *)(local_58 + 8);
      }
      local_2c = *(uint32_t *)(local_58 + 0x84);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_2c;
}

Assistant:

unsigned int GetNextWorkRequired(const CBlockIndex* pindexLast, const CBlockHeader *pblock, const Consensus::Params& params)
{
    assert(pindexLast != nullptr);
    unsigned int nProofOfWorkLimit = UintToArith256(params.powLimit).GetCompact();

    // Only change once per difficulty adjustment interval
    if ((pindexLast->nHeight+1) % params.DifficultyAdjustmentInterval() != 0)
    {
        if (params.fPowAllowMinDifficultyBlocks)
        {
            // Special difficulty rule for testnet:
            // If the new block's timestamp is more than 2* 10 minutes
            // then allow mining of a min-difficulty block.
            if (pblock->GetBlockTime() > pindexLast->GetBlockTime() + params.nPowTargetSpacing*2)
                return nProofOfWorkLimit;
            else
            {
                // Return the last non-special-min-difficulty-rules-block
                const CBlockIndex* pindex = pindexLast;
                while (pindex->pprev && pindex->nHeight % params.DifficultyAdjustmentInterval() != 0 && pindex->nBits == nProofOfWorkLimit)
                    pindex = pindex->pprev;
                return pindex->nBits;
            }
        }
        return pindexLast->nBits;
    }

    // Go back by what we want to be 14 days worth of blocks
    int nHeightFirst = pindexLast->nHeight - (params.DifficultyAdjustmentInterval()-1);
    assert(nHeightFirst >= 0);
    const CBlockIndex* pindexFirst = pindexLast->GetAncestor(nHeightFirst);
    assert(pindexFirst);

    return CalculateNextWorkRequired(pindexLast, pindexFirst->GetBlockTime(), params);
}